

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  uint8_t uVar1;
  int iVar2;
  Inst *pIVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  LogMessage LStack_188;
  
  uVar6 = (ulong)root;
  pIVar3 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  uVar4 = pIVar3[uVar6].out_opcode_ & 7;
  if (uVar4 == 2) {
    if ((pIVar3[uVar6].field_1.field_3.lo_ == pIVar3[id].field_1.field_3.lo_) &&
       (pIVar3[uVar6].field_1.field_3.hi_ == pIVar3[id].field_1.field_3.hi_)) {
      uVar5 = 0;
      uVar7 = (ulong)(uint)root;
      if (((pIVar3[id].field_1.field_3.hint_foldcase_ ^ pIVar3[uVar6].field_1.field_3.hint_foldcase_
           ) & 1) != 0) {
        uVar7 = uVar5;
      }
    }
    else {
LAB_001bc922:
      uVar5 = 0;
      uVar7 = 0;
    }
  }
  else {
    do {
      if ((pIVar3[root].out_opcode_ & 7) != 0) {
        LogMessage::LogMessage
                  (&LStack_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/compile.cc"
                   ,0x275);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&LStack_188.str_,"should never happen",0x13);
        LogMessage::~LogMessage(&LStack_188);
        goto LAB_001bc922;
      }
      iVar2 = pIVar3[root].field_1.cap_;
      uVar1 = pIVar3[id].field_1.field_3.lo_;
      if (((pIVar3[iVar2].field_1.field_3.lo_ == uVar1) &&
          (pIVar3[iVar2].field_1.field_3.hi_ == pIVar3[id].field_1.field_3.hi_)) &&
         (((pIVar3[id].field_1.field_3.hint_foldcase_ ^ pIVar3[iVar2].field_1.field_3.hint_foldcase_
           ) & 1) == 0)) {
        uVar4 = root * 2 + 1;
        uVar9 = 0;
        uVar6 = (ulong)(uint)root;
      }
      else {
        uVar9 = 0;
        if ((this->reversed_ & 1U) == 0) {
          uVar4 = 0;
          uVar6 = 0;
        }
        else {
          uVar8 = pIVar3[root].out_opcode_ >> 4;
          if ((pIVar3[uVar8].out_opcode_ & 7) == 0) {
            uVar9 = 1;
            root = uVar8;
          }
          else if ((pIVar3[uVar8].field_1.field_3.lo_ == uVar1) &&
                  (pIVar3[uVar8].field_1.field_3.hi_ == pIVar3[id].field_1.field_3.hi_)) {
            uVar9 = 0;
            bVar10 = ((pIVar3[id].field_1.field_3.hint_foldcase_ ^
                      pIVar3[uVar8].field_1.field_3.hint_foldcase_) & 1) != 0;
            uVar4 = root * 2;
            if (bVar10) {
              uVar4 = uVar9;
            }
            uVar6 = 0;
            if (!bVar10) {
              uVar6 = (ulong)(uint)root;
            }
          }
          else {
            uVar4 = 0;
            uVar6 = 0;
            uVar9 = 0;
          }
        }
      }
    } while ((char)uVar9 != '\0');
    uVar5 = (ulong)uVar4 << 0x20;
    uVar7 = uVar6;
  }
  return (Frag)(uVar7 & 0xffffffff | uVar5);
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, nullPatchList);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1));

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1));
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}